

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void __thiscall depspawn::Observer::~Observer(Observer *this)

{
  Workitem *pWVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  byte bVar5;
  __node_base_ptr p_Var6;
  uint uVar7;
  __node_base_ptr p_Var8;
  Workitem *pWVar9;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  fathers;
  undefined1 local_82;
  undefined1 local_81;
  Workitem *local_80;
  Observer *local_78;
  Workitem *local_70;
  _Hashtable<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>,_std::__detail::_Identity,_std::equal_to<depspawn::internal::Workitem_*>,_std::hash<depspawn::internal::Workitem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_70 = this->cur_father_;
  local_78 = this;
  std::
  _Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<depspawn::internal::Workitem*const*>
            ((_Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,&local_70,&local_68,0,&local_80,&local_81,&local_82);
  LOCK();
  (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + 1;
  UNLOCK();
  do {
  } while (((anonymous_namespace)::eraser_assigned & 1) != 0);
  pWVar9 = local_78->cur_father_;
  if (pWVar9 != (Workitem *)0x0) {
    pWVar9 = local_78->limit_;
  }
  uVar7 = 1;
  do {
    local_80 = (anonymous_namespace)::worklist;
    if (pWVar9 == (anonymous_namespace)::worklist) {
      bVar5 = 0;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      bVar5 = 0;
      do {
        pWVar1 = local_80->father;
        p_Var2 = local_68._M_buckets[(ulong)pWVar1 % local_68._M_bucket_count];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var2, p_Var8 = p_Var2->_M_nxt, pWVar1 != (Workitem *)p_Var2->_M_nxt[1]._M_nxt
           )) {
          while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var3[1]._M_nxt % local_68._M_bucket_count !=
                 (ulong)pWVar1 % local_68._M_bucket_count) ||
               (p_Var6 = p_Var8, p_Var8 = p_Var3, pWVar1 == (Workitem *)p_Var3[1]._M_nxt))
            goto LAB_0010b7ae;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_0010b7ae:
        if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
          if ((uVar7 & 1) == 0) {
            internal::TaskPool::try_run(internal::TP);
          }
        }
        else {
          local_70 = (Workitem *)&local_68;
          std::
          _Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<depspawn::internal::Workitem*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<depspawn::internal::Workitem*,false>>>>
                    ((_Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_68,&local_80,&local_70);
          if ((short)local_80->status < 4) {
            bVar4 = internal::TaskPool::try_run(internal::TP);
            bVar5 = bVar4 | bVar5;
            bVar4 = true;
          }
        }
        local_80 = local_80->next;
      } while (local_80 != pWVar9);
    }
    if (bVar5 == 0) {
      uVar7 = *(uint *)&local_78->priority_;
    }
    else {
      uVar7 = uVar7 & 0xff;
    }
    if (!bVar4) {
      LOCK();
      (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + -1;
      UNLOCK();
      std::
      _Hashtable<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>,_std::__detail::_Identity,_std::equal_to<depspawn::internal::Workitem_*>,_std::hash<depspawn::internal::Workitem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
  } while( true );
}

Assistant:

Observer::~Observer()
  { std::unordered_set<internal::Workitem *> fathers({cur_father_});
    internal::Workitem *p;
    bool must_reiterate;
    
    ObserversAtWork.fetch_add(1); //disable future attempts to erase Workitems during my activity
    while (eraser_assigned) {
      // Wait for current eraser, if any, to finish
    }
    
    /* if there was a cur_father_, since we are inside it, and limit_ is it or more recent,
     limit_ cannot have been deallocated, so limit_ is a safe limit.
     
     if cur_father_=null and limit_ was deallocated, all previous tasks finished,
     and so we have to execute everything up to the end of the list, which is cur_father_=null.
     
     if cur_father_=null and limit_ was not deallocated, we have to execute
     everything up to limit_, but it could have been deallocated, so null is a safe limit,
     although we are waiting for more task that we should actually do.
     
     Also it is interesting to notice that no Workitem in the high-level critical path can
     be Filling, but Workitems descended from them could.
     */
    
    internal::Workitem * const safe_end = (cur_father_ != nullptr) ? limit_ : nullptr;
    //printf("%p w until %p!=NULL->%p\n", enum_thr_spec_father, cur_father_, limit_);

    //The first round always has priority, i.e., is only devoted to the critical path
    bool priority = true;

    do {
      must_reiterate = false;
      bool helped = false;
  
      // We must begin from worklist because new work we must do may have been spawned
      for (p = worklist; p != safe_end; p = p->next) {
        if (fathers.find(p->father) != fathers.end()) { //Workitem in the critical path
          fathers.insert(p); //it could be the father of other tasks that would have to finish
          if (p->status < Workitem::Status_t::Done) {
            must_reiterate = true;
            bool helped_here = try_to_run(p);
            helped = helped || helped_here;
          }
        } else {
          if (!priority) {
            try_to_run(p);
          }
        }
      }
      
      // While we are able to help with tasks in the critical path, we remain focused on it.
      // Otherwise we adopt the priority specified by the user.
      priority = helped ? priority : priority_;
      
    } while (must_reiterate);
    
    //printf("%p exit\n", enum_thr_spec_father);
    
    ObserversAtWork.fetch_sub(1); //I'm done
  }